

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XFileParser.cpp
# Opt level: O2

void __thiscall Assimp::XFileParser::ParseUnknownDataObject(XFileParser *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  allocator<char> local_71;
  string local_70;
  string t;
  
  do {
    GetNextToken_abi_cxx11_(&t,this);
    if (t._M_string_length == 0) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"Unexpected end of file while parsing unknown segment.",
                 &local_71);
      ThrowException(this,&local_70);
    }
    bVar1 = std::operator==(&t,"{");
    std::__cxx11::string::~string((string *)&t);
  } while (!bVar1);
  iVar3 = 1;
  while( true ) {
    if (iVar3 == 0) {
      return;
    }
    GetNextToken_abi_cxx11_(&t,this);
    if (t._M_string_length == 0) break;
    bVar1 = std::operator==(&t,"{");
    iVar2 = 1;
    if (!bVar1) {
      bVar1 = std::operator==(&t,"}");
      iVar2 = -(uint)bVar1;
    }
    iVar3 = iVar3 + iVar2;
    std::__cxx11::string::~string((string *)&t);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_70,"Unexpected end of file while parsing unknown segment.",&local_71);
  ThrowException(this,&local_70);
}

Assistant:

void XFileParser::ParseUnknownDataObject()
{
    // find opening delimiter
    bool running = true;
    while( running )
    {
        std::string t = GetNextToken();
        if( t.length() == 0)
            ThrowException( "Unexpected end of file while parsing unknown segment.");

        if( t == "{")
            break;
    }

    unsigned int counter = 1;

    // parse until closing delimiter
    while( counter > 0)
    {
        std::string t = GetNextToken();

        if( t.length() == 0)
            ThrowException( "Unexpected end of file while parsing unknown segment.");

        if( t == "{")
            ++counter;
        else
        if( t == "}")
            --counter;
    }
}